

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath1.0.c
# Opt level: O2

LY_ERR lyplg_type_print_xpath10_value
                 (lyd_value_xpath10 *xp_val,LY_VALUE_FORMAT format,void *prefix_data,
                 char **str_value,ly_err_item **err)

{
  ushort in_AX;
  LY_ERR LVar1;
  long lVar2;
  uint16_t expr_idx;
  ulong uStack_28;
  uint32_t str_len;
  
  uStack_28 = (ulong)in_AX;
  *str_value = (char *)0x0;
  *err = (ly_err_item *)0x0;
  if (format == LY_VALUE_XML) {
    lVar2 = **(long **)((long)prefix_data + 8);
    **(long **)((long)prefix_data + 8) = 0;
  }
  else {
    lVar2 = 0;
  }
  LVar1 = xpath10_print_subexpr_r
                    (&expr_idx,LYXP_TOKEN_NONE,(lys_module *)0x0,xp_val,format,prefix_data,str_value
                     ,&str_len,err);
  if (lVar2 != 0) {
    **(long **)((long)prefix_data + 8) = lVar2;
  }
  if (LVar1 != LY_SUCCESS) {
    free(*str_value);
    *str_value = (char *)0x0;
  }
  return LVar1;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_print_xpath10_value(const struct lyd_value_xpath10 *xp_val, LY_VALUE_FORMAT format, void *prefix_data,
        char **str_value, struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    uint16_t expr_idx = 0;
    uint32_t str_len = 0;
    const struct lys_module *local_mod = NULL;
    struct ly_set *mods;

    *str_value = NULL;
    *err = NULL;

    if (format == LY_VALUE_XML) {
        /* null the local module so that all the prefixes are printed */
        mods = prefix_data;
        local_mod = mods->objs[0];
        mods->objs[0] = NULL;
    }

    /* recursively print the expression */
    ret = xpath10_print_subexpr_r(&expr_idx, 0, NULL, xp_val, format, prefix_data, str_value, &str_len, err);

    if (local_mod) {
        mods->objs[0] = (void *)local_mod;
    }
    if (ret) {
        free(*str_value);
        *str_value = NULL;
    }
    return ret;
}